

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_GLSL_IFC(Context *ctx)

{
  char *pcVar1;
  char local_98 [8];
  char src1 [64];
  char src0 [64];
  char *comp;
  Context *ctx_local;
  
  pcVar1 = get_GLSL_comparison_string_scalar(ctx);
  make_GLSL_srcarg_string_scalar(ctx,0,src1 + 0x38,0x40);
  make_GLSL_srcarg_string_scalar(ctx,1,local_98,0x40);
  output_line(ctx,"if (%s %s %s) {",src1 + 0x38,pcVar1,local_98);
  ctx->indent = ctx->indent + 1;
  return;
}

Assistant:

static void emit_GLSL_IFC(Context *ctx)
{
    const char *comp = get_GLSL_comparison_string_scalar(ctx);
    char src0[64]; make_GLSL_srcarg_string_scalar(ctx, 0, src0, sizeof (src0));
    char src1[64]; make_GLSL_srcarg_string_scalar(ctx, 1, src1, sizeof (src1));
    output_line(ctx, "if (%s %s %s) {", src0, comp, src1);
    ctx->indent++;
}